

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

QList<QString> * __thiscall
QMap<QString,_QList<QString>_>::operator[](QMap<QString,_QList<QString>_> *this,QString *key)

{
  QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>
  *pQVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_QString,_QList<QString>_>_>,_bool> pVar3;
  QArrayDataPointer<QString> local_88;
  pair<const_QString,_QList<QString>_> local_68;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_>
  local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_*>
        )(this->d).d.ptr;
  if ((local_38.d.ptr ==
       (QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(((QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>
           *)local_38.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_38.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_*>
          )(QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>
            *)0x0;
  }
  else {
    LOCK();
    (((QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>
       *)local_38.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>
                        *)local_38.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  detach(this);
  iVar2 = std::
          _Rb_tree<QString,_std::pair<const_QString,_QList<QString>_>,_std::_Select1st<std::pair<const_QString,_QList<QString>_>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>
          ::find(&(((this->d).d.ptr)->m)._M_t,key);
  pQVar1 = (this->d).d.ptr;
  if ((_Rb_tree_header *)iVar2._M_node == &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header) {
    local_88.d = (Data *)0x0;
    local_88.ptr = (QString *)0x0;
    local_88.size = 0;
    std::pair<const_QString,_QList<QString>_>::pair<QList<QString>,_true>
              (&local_68,key,(QList<QString> *)&local_88);
    pVar3 = std::
            _Rb_tree<QString,std::pair<QString_const,QList<QString>>,std::_Select1st<std::pair<QString_const,QList<QString>>>,std::less<QString>,std::allocator<std::pair<QString_const,QList<QString>>>>
            ::_M_insert_unique<std::pair<QString_const,QList<QString>>>
                      ((_Rb_tree<QString,std::pair<QString_const,QList<QString>>,std::_Select1st<std::pair<QString_const,QList<QString>>>,std::less<QString>,std::allocator<std::pair<QString_const,QList<QString>>>>
                        *)&pQVar1->m,&local_68);
    iVar2._M_node = (_Base_ptr)pVar3.first._M_node;
    std::pair<const_QString,_QList<QString>_>::~pair(&local_68);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QList<QString>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QList<QString>_>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QList<QString> *)&iVar2._M_node[1]._M_right;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }